

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void out_token(c2m_ctx_t c2m_ctx,token_t t)

{
  short sVar1;
  ushort uVar2;
  pre_ctx *ppVar3;
  long lVar4;
  MIR_error_func_t p_Var5;
  uint *puVar6;
  gen_ctx *pgVar7;
  short *psVar8;
  macro_t pmVar9;
  VARR_macro_call_t *pVVar10;
  VARR_char *pVVar11;
  token_t *pptVar12;
  pos_t pVar13;
  char *pcVar14;
  MIR_item_t pMVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  token_t *pptVar19;
  VARR_token_t *pVVar20;
  VARR_token_t *extraout_RAX;
  c2m_ctx_t pcVar21;
  void *pvVar22;
  long lVar23;
  c2m_ctx_t pcVar24;
  MIR_context_t pMVar25;
  c2m_ctx_t pcVar26;
  token_t ptVar27;
  token_t ptVar28;
  macro_call_t pmVar29;
  VARR_token_arr_t *pVVar30;
  ulong *puVar31;
  c2m_ctx_t pcVar32;
  token_arr_t pVVar33;
  token_arr_t *ppVVar34;
  macro_call_t *__ptr;
  c2m_ctx_t pcVar35;
  node_t_conflict pnVar36;
  long *plVar37;
  undefined8 *puVar38;
  token_t *in_RCX;
  MIR_context_t pMVar39;
  MIR_context_t pMVar40;
  undefined1 *puVar41;
  uint uVar42;
  ulong *extraout_RDX;
  token_t t_00;
  ulong uVar43;
  char *format;
  long extraout_RDX_00;
  VARR_char *pVVar44;
  c2m_ctx_t pcVar45;
  c2m_ctx_t pcVar46;
  c2m_ctx_t pcVar47;
  char *pcVar48;
  char **in_R8;
  ulong uVar49;
  token_t t_01;
  MIR_context_t pMVar50;
  char cVar51;
  c2m_ctx_t unaff_R14;
  MIR_context_t pMVar52;
  c2m_ctx_t pcVar53;
  size_t sVar54;
  size_t sVar55;
  c2mir_options *pcVar56;
  bool bVar57;
  bool bVar58;
  str_t sVar59;
  MIR_context_t pMStack_150;
  MIR_context_t pMStack_138;
  MIR_context_t pMStack_130;
  c2m_ctx_t pcStack_118;
  uint uStack_bc;
  
  ppVar3 = c2m_ctx->pre_ctx;
  pcVar46 = (c2m_ctx_t)t;
  pcVar47 = c2m_ctx;
  if (ppVar3->no_out_p == 0) {
    if (ppVar3->macro_call_stack == (VARR_macro_call_t *)0x0) goto LAB_00190c94;
    if (ppVar3->macro_call_stack->els_num != 0) goto LAB_00190bc6;
    pVVar20 = ppVar3->output_buffer;
    if (pVVar20 != (VARR_token_t *)0x0) {
      uVar49 = 0;
      do {
        in_RCX = pVVar20->varr;
        unaff_R14 = c2m_ctx;
        if (pVVar20->els_num <= uVar49) goto LAB_00190c64;
        if (in_RCX == (token_t *)0x0) {
          out_token_cold_3();
          goto LAB_00190c8f;
        }
        pcVar46 = (c2m_ctx_t)in_RCX[uVar49];
        pcVar47 = c2m_ctx;
        (*ppVar3->pre_out_token_func)(c2m_ctx,(token_t)pcVar46);
        pVVar20 = ppVar3->output_buffer;
        uVar49 = uVar49 + 1;
      } while (pVVar20 != (VARR_token_t *)0x0);
    }
    out_token_cold_4();
    pVVar20 = extraout_RAX;
LAB_00190c64:
    if (in_RCX != (token_t *)0x0) {
      pVVar20->els_num = 0;
      (*ppVar3->pre_out_token_func)(unaff_R14,t);
      return;
    }
  }
  else {
LAB_00190bc6:
    pVVar20 = ppVar3->output_buffer;
    pptVar19 = pVVar20->varr;
    if (pptVar19 != (token_t *)0x0) {
      sVar55 = pVVar20->els_num;
      uVar49 = sVar55 + 1;
      if (pVVar20->size < uVar49) {
        sVar55 = (uVar49 >> 1) + uVar49;
        pptVar19 = (token_t *)realloc(pptVar19,sVar55 * 8);
        pVVar20->varr = pptVar19;
        pVVar20->size = sVar55;
        sVar55 = pVVar20->els_num;
        uVar49 = sVar55 + 1;
      }
      pVVar20->els_num = uVar49;
      pptVar19[sVar55] = t;
      return;
    }
LAB_00190c8f:
    out_token_cold_1();
LAB_00190c94:
    out_token_cold_5();
  }
  out_token_cold_2();
  pcVar32 = pcVar47;
  pcVar21 = pcVar46;
  if (pcVar46 != (c2m_ctx_t)0x0) goto LAB_00190cc1;
  while( true ) {
    do {
      pcVar46 = (c2m_ctx_t)0x0;
      pcVar32 = pcVar47;
      pcVar21 = (c2m_ctx_t)get_next_pptoken_1(pcVar47,0);
LAB_00190cc1:
      if ((*(short *)&pcVar21->ctx == 10) || (*(short *)&pcVar21->ctx == 0x147)) {
        unget_next_pptoken((c2m_ctx_t)pcVar47->buffered_tokens,(token_t)pcVar21);
        return;
      }
    } while (extraout_RDX == (ulong *)0x0);
    pvVar22 = (void *)extraout_RDX[2];
    if (pvVar22 == (void *)0x0) break;
    uVar43 = *extraout_RDX;
    uVar49 = uVar43 + 1;
    if (extraout_RDX[1] < uVar49) {
      uVar49 = (uVar49 >> 1) + uVar49;
      pvVar22 = realloc(pvVar22,uVar49 * 8);
      extraout_RDX[2] = (ulong)pvVar22;
      extraout_RDX[1] = uVar49;
      uVar43 = *extraout_RDX;
      uVar49 = uVar43 + 1;
    }
    *extraout_RDX = uVar49;
    *(c2m_ctx_t *)((long)pvVar22 + uVar43 * 8) = pcVar21;
  }
  skip_nl_cold_1();
  if (((pcVar32 != (c2m_ctx_t)0x0) && (lVar4 = pcVar32->env[0].__jmpbuf[0], lVar4 != 0)) &&
     (pMVar40 = pcVar32->ctx, pMVar40 != (MIR_context_t)0x0)) {
    pcVar32->ctx = (MIR_context_t)((long)&pMVar40[-1].wrapper_end_addr + 7);
    pmVar29 = *(macro_call_t *)(lVar4 + -8 + (long)pMVar40 * 8);
    pmVar29->macro->ignore_p = 0;
    free_macro_call(pmVar29);
    return;
  }
  pop_macro_call_cold_1();
  pMVar40 = pcVar46->ctx;
  p_Var5 = pMVar40->error_func;
  pcVar21 = pcVar46;
  pcVar47 = pcVar32;
  if (p_Var5 != (MIR_error_func_t)0x0) {
    iVar17 = *(int *)p_Var5;
    iVar18 = (int)pcVar46->env[0].__jmpbuf[2];
    if (iVar18 < iVar17) {
      lVar4 = *(long *)(p_Var5 + 0x10);
      uStack_bc = 0xffffffff;
      pcVar35 = pcVar46;
      do {
        *(int *)(pcVar46->env[0].__jmpbuf + 2) = iVar18 + 1;
        ptVar27 = *(token_t *)(lVar4 + (long)iVar18 * 8);
        sVar1 = *(short *)ptVar27;
        if (sVar1 == 0x103) {
          pcVar47 = (c2m_ctx_t)pMVar40->c2mir_ctx;
          pcVar35 = (c2m_ctx_t)ptVar27->repr;
          uVar16 = find_param((VARR_token_t *)pcVar47,(char *)pcVar35);
          if ((int)uVar16 < 0) goto LAB_00190f61;
          puVar31 = (ulong *)pcVar46->env[0].__jmpbuf[1];
          if (((puVar31 == (ulong *)0x0) || (puVar31[2] == 0)) || (*puVar31 <= (ulong)uVar16)) {
LAB_001915b8:
            process_replacement_cold_18();
LAB_001915bd:
            process_replacement_cold_9();
LAB_001915c2:
            process_replacement_cold_10();
LAB_001915c7:
            process_replacement_cold_3();
            pcVar21 = pcVar35;
LAB_001915cc:
            pcVar35 = pcVar21;
            process_replacement_cold_7();
LAB_001915d1:
            process_replacement_cold_12();
LAB_001915d6:
            process_replacement_cold_2();
LAB_001915db:
            process_replacement_cold_8();
            pcVar21 = pcVar35;
            goto LAB_001915e0;
          }
          pcVar35 = *(c2m_ctx_t *)(puVar31[2] + (ulong)uVar16 * 8);
          if (-1 < (int)uStack_bc) {
            pcVar21 = (c2m_ctx_t)(ulong)uStack_bc;
            del_tokens((VARR_token_t *)pcVar46->env[0].__jmpbuf[3],uStack_bc,-1);
            pcVar47 = pcVar35;
            if (pcVar35 == (c2m_ctx_t)0x0) goto LAB_001915f9;
            pMVar25 = pcVar35->ctx;
            if (pMVar25 == (MIR_context_t)0x0) {
LAB_0019101d:
              pMVar39 = pcVar46->ctx;
            }
            else {
              puVar38 = (undefined8 *)pcVar35->env[0].__jmpbuf[0];
              if (puVar38 == (undefined8 *)0x0) goto LAB_00191603;
              sVar1 = *(short *)*puVar38;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar21 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar35,0,1);
                pMVar25 = pcVar35->ctx;
                if (pMVar25 == (MIR_context_t)0x0) goto LAB_0019101d;
              }
              pMVar39 = (MIR_context_t)pcVar35->env[0].__jmpbuf[0];
              if (pMVar39 == (MIR_context_t)0x0) goto LAB_0019160d;
              sVar1 = (short)(&pMVar39->temp_data)[(long)&pMVar25[-1].wrapper_end_addr]->els_num;
              if (((sVar1 == 10) || (sVar1 == 0x20)) &&
                 (pMVar25 = (MIR_context_t)((long)&pMVar25[-1].wrapper_end_addr + 7),
                 pcVar35->ctx = pMVar25, pMVar25 == (MIR_context_t)0x0)) goto LAB_0019101d;
            }
            pgVar7 = pMVar39->gen_ctx;
            pcVar48 = (pcVar32->empty_str).s;
            sVar55 = (pcVar32->empty_str).len;
            pVar13 = *(pos_t *)&pgVar7->optimize_level;
            pnVar36 = new_node(pcVar32,N_STR);
            add_pos(pcVar32,pnVar36,pVar13);
            (pnVar36->u).s.s = pcVar48;
            (pnVar36->u).s.len = sVar55;
            pcVar14 = *(char **)&pgVar7->optimize_level;
            pMVar15 = pgVar7->curr_func_item;
            sVar59 = uniq_cstr(pcVar32,"");
            pcVar48 = sVar59.s;
            pcVar21 = (c2m_ctx_t)0x30;
            pcVar47 = pcVar32;
            pcVar24 = (c2m_ctx_t)reg_malloc(pcVar32,0x30);
            *(undefined4 *)&pcVar24->ctx = 0x102;
            ((pos_t *)&pcVar24->options)->fname = pcVar14;
            pcVar24->env[0].__jmpbuf[0] = (long)pMVar15;
            pcVar24->env[0].__jmpbuf[3] = (long)pcVar48;
            *(undefined4 *)(pcVar24->env[0].__jmpbuf + 1) = 0;
            pcVar24->env[0].__jmpbuf[2] = (long)pnVar36;
            pVVar44 = pcVar32->temp_string;
            if ((pVVar44 != (VARR_char *)0x0) &&
               (pcVar26 = (c2m_ctx_t)pVVar44->varr, pcVar26 != (c2m_ctx_t)0x0)) {
              pVVar44->els_num = 0;
              cVar51 = *pcVar48;
              if (cVar51 == '\0') {
                uVar49 = 1;
                sVar55 = 0;
              }
              else {
                do {
                  pcVar48 = pcVar48 + 1;
                  pVVar44 = pcVar32->temp_string;
                  pcVar26 = (c2m_ctx_t)pVVar44->varr;
                  if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_001915cc;
                  sVar55 = pVVar44->els_num;
                  uVar49 = sVar55 + 1;
                  if (pVVar44->size < uVar49) {
                    pcVar45 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
                    pcVar21 = pcVar45;
                    pcVar47 = pcVar26;
                    pcVar26 = (c2m_ctx_t)realloc(pcVar26,(size_t)pcVar45);
                    pVVar44->varr = (char *)pcVar26;
                    pVVar44->size = (size_t)pcVar45;
                    sVar55 = pVVar44->els_num;
                    uVar49 = sVar55 + 1;
                  }
                  pVVar44->els_num = uVar49;
                  *(char *)((long)pcVar26->env[0].__jmpbuf + (sVar55 - 0x10)) = cVar51;
                  cVar51 = *pcVar48;
                } while (cVar51 != '\0');
                pVVar44 = pcVar32->temp_string;
                pcVar26 = (c2m_ctx_t)pVVar44->varr;
                if (pcVar26 == (c2m_ctx_t)0x0) goto LAB_00191608;
                sVar55 = pVVar44->els_num;
                uVar49 = sVar55 + 1;
              }
              if (pVVar44->size < uVar49) {
                sVar54 = (uVar49 >> 1) + uVar49;
                pcVar47 = pcVar26;
                pcVar26 = (c2m_ctx_t)realloc(pcVar26,sVar54);
                pVVar44->varr = (char *)pcVar26;
                pVVar44->size = sVar54;
                sVar55 = pVVar44->els_num;
                uVar49 = sVar55 + 1;
              }
              pVVar44->els_num = uVar49;
              *(undefined1 *)((long)pcVar26->env[0].__jmpbuf + (sVar55 - 0x10)) = 0x22;
              if (pcVar35->ctx != (MIR_context_t)0x0) {
                pMVar25 = (MIR_context_t)0x0;
                do {
                  lVar23 = pcVar35->env[0].__jmpbuf[0];
                  if (lVar23 == 0) goto LAB_001915d1;
                  psVar8 = *(short **)(lVar23 + (long)pMVar25 * 8);
                  sVar1 = *psVar8;
                  if ((sVar1 == 0x20) || (sVar1 == 10)) {
                    pVVar44 = pcVar32->temp_string;
                    pcVar21 = (c2m_ctx_t)pVVar44->varr;
                    if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_001915db;
                    sVar55 = pVVar44->els_num;
                    uVar49 = sVar55 + 1;
                    if (pVVar44->size < uVar49) {
                      sVar54 = (uVar49 >> 1) + uVar49;
                      pcVar47 = pcVar21;
                      pcVar21 = (c2m_ctx_t)realloc(pcVar21,sVar54);
                      pVVar44->varr = (char *)pcVar21;
                      pVVar44->size = sVar54;
                      sVar55 = pVVar44->els_num;
                      uVar49 = sVar55 + 1;
                    }
                    pVVar44->els_num = uVar49;
                    *(undefined1 *)((long)pcVar21->env[0].__jmpbuf + (sVar55 - 0x10)) = 0x20;
                  }
                  else {
                    pcVar48 = *(char **)(psVar8 + 0x14);
                    cVar51 = *pcVar48;
                    if (cVar51 != '\0') {
                      pMVar39 = (MIR_context_t)((long)&pMVar25->gen_ctx + 1);
                      do {
                        uVar16 = 0;
                        if (pcVar35->ctx != pMVar39) {
                          if ((pcVar35->ctx <= pMVar39) ||
                             (lVar23 = pcVar35->env[0].__jmpbuf[0], lVar23 == 0)) goto LAB_001915bd;
                          uVar16 = (uint)**(char **)(*(long *)(lVar23 + 8 + (long)pMVar25 * 8) +
                                                    0x28);
                        }
                        if (cVar51 == '\"') {
LAB_001912ac:
                          pVVar44 = pcVar32->temp_string;
                          pcVar21 = (c2m_ctx_t)pVVar44->varr;
                          if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_001915c2;
                          sVar55 = pVVar44->els_num;
                          uVar49 = sVar55 + 1;
                          if (pVVar44->size < uVar49) {
                            sVar54 = (uVar49 >> 1) + uVar49;
                            pcVar47 = pcVar21;
                            pcVar21 = (c2m_ctx_t)realloc(pcVar21,sVar54);
                            pVVar44->varr = (char *)pcVar21;
                            pVVar44->size = sVar54;
                            sVar55 = pVVar44->els_num;
                            uVar49 = sVar55 + 1;
                          }
                          pVVar44->els_num = uVar49;
                          *(undefined1 *)((long)pcVar21->env[0].__jmpbuf + (sVar55 - 0x10)) = 0x5c;
                          cVar51 = *pcVar48;
                        }
                        else if (cVar51 == '\\') {
                          cVar51 = '\\';
                          if (((0x37 < uVar16 - 0x3f) ||
                              ((0xa880cc20000001U >> ((ulong)(uVar16 - 0x3f) & 0x3f) & 1) == 0)) &&
                             ((uVar16 & 0xffffffdf) != 0x58 && (uVar16 & 0xfffffff8) != 0x30))
                          goto LAB_001912ac;
                        }
                        pVVar44 = pcVar32->temp_string;
                        pcVar21 = (c2m_ctx_t)pVVar44->varr;
                        if (pcVar21 == (c2m_ctx_t)0x0) {
                          process_replacement_cold_11();
                          goto LAB_001915b8;
                        }
                        sVar55 = pVVar44->els_num;
                        uVar49 = sVar55 + 1;
                        if (pVVar44->size < uVar49) {
                          sVar54 = (uVar49 >> 1) + uVar49;
                          pcVar47 = pcVar21;
                          pcVar21 = (c2m_ctx_t)realloc(pcVar21,sVar54);
                          pVVar44->varr = (char *)pcVar21;
                          pVVar44->size = sVar54;
                          sVar55 = pVVar44->els_num;
                          uVar49 = sVar55 + 1;
                        }
                        pVVar44->els_num = uVar49;
                        *(char *)((long)pcVar21->env[0].__jmpbuf + (sVar55 - 0x10)) = cVar51;
                        cVar51 = pcVar48[1];
                        pcVar48 = pcVar48 + 1;
                      } while (cVar51 != '\0');
                    }
                  }
                  pMVar25 = (MIR_context_t)((long)&pMVar25->gen_ctx + 1);
                } while (pMVar25 < pcVar35->ctx);
              }
              pVVar44 = pcVar32->temp_string;
              pcVar21 = (c2m_ctx_t)pVVar44->varr;
              if (pcVar21 != (c2m_ctx_t)0x0) {
                sVar55 = pVVar44->els_num;
                uVar49 = sVar55 + 1;
                if (pVVar44->size < uVar49) {
                  pcVar26 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
                  pcVar35 = pcVar26;
                  pcVar47 = pcVar21;
                  pcVar21 = (c2m_ctx_t)realloc(pcVar21,(size_t)pcVar26);
                  pVVar44->varr = (char *)pcVar21;
                  pVVar44->size = (size_t)pcVar26;
                  sVar55 = pVVar44->els_num;
                  uVar49 = sVar55 + 1;
                }
                pVVar44->els_num = uVar49;
                *(undefined1 *)((long)pcVar21->env[0].__jmpbuf + (sVar55 - 0x10)) = 0x22;
                pVVar44 = pcVar32->temp_string;
                pcVar21 = (c2m_ctx_t)pVVar44->varr;
                if (pcVar21 != (c2m_ctx_t)0x0) {
                  sVar55 = pVVar44->els_num;
                  uVar49 = sVar55 + 1;
                  if (pVVar44->size < uVar49) {
                    pcVar26 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
                    pcVar35 = pcVar26;
                    pcVar47 = pcVar21;
                    pcVar21 = (c2m_ctx_t)realloc(pcVar21,(size_t)pcVar26);
                    pVVar44->varr = (char *)pcVar21;
                    pVVar44->size = (size_t)pcVar26;
                    sVar55 = pVVar44->els_num;
                    uVar49 = sVar55 + 1;
                  }
                  pVVar44->els_num = uVar49;
                  *(undefined1 *)((long)pcVar21->env[0].__jmpbuf + (sVar55 - 0x10)) = 0;
                  if (pcVar32->temp_string != (VARR_char *)0x0) {
                    sVar59 = uniq_cstr(pcVar32,pcVar32->temp_string->varr);
                    pcVar24->env[0].__jmpbuf[3] = (long)sVar59.s;
                    set_string_val(pcVar32,(token_t)pcVar24,pcVar32->temp_string,0x20);
                    goto LAB_00190f77;
                  }
                  goto LAB_001915fe;
                }
                goto LAB_001915f4;
              }
              goto LAB_001915ef;
            }
            goto LAB_001915e5;
          }
          iVar18 = (int)pcVar46->env[0].__jmpbuf[2];
          lVar23 = (long)iVar18;
          if (((lVar23 < 2) ||
              ((sVar1 = **(short **)(lVar4 + -0x10 + lVar23 * 8), sVar1 != 0x142 &&
               (((iVar18 == 2 || (sVar1 != 0x20)) ||
                (**(short **)(lVar4 + -0x18 + lVar23 * 8) != 0x142)))))) &&
             (((iVar17 <= iVar18 || (**(short **)(lVar4 + lVar23 * 8) != 0x142)) &&
              ((iVar17 <= iVar18 + 1 ||
               ((**(short **)(lVar4 + (long)(iVar18 + 1) * 8) != 0x142 ||
                (**(short **)(lVar4 + lVar23 * 8) != 0x20)))))))) {
            pcVar48 = (ptVar27->pos).fname;
            iVar17 = (ptVar27->pos).lno;
            iVar18 = (ptVar27->pos).ln_pos;
            ptVar28 = (token_t)reg_malloc(pcVar32,0x30);
            *(undefined4 *)ptVar28 = 0x144;
            (ptVar28->pos).fname = pcVar48;
            (ptVar28->pos).lno = iVar17;
            (ptVar28->pos).ln_pos = iVar18;
            ptVar28->repr = "";
            ptVar28->node_code = N_IGNORE;
            ptVar28->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)pcVar32->buffered_tokens,ptVar28);
            copy_and_push_back(pcVar32,(VARR_token_t *)pcVar35,*(pos_t *)&pcVar46->options);
            pcVar48 = (ptVar27->pos).fname;
            iVar17 = (ptVar27->pos).lno;
            iVar18 = (ptVar27->pos).ln_pos;
            ptVar27 = (token_t)reg_malloc(pcVar32,0x30);
            *(undefined4 *)ptVar27 = 0x143;
            (ptVar27->pos).fname = pcVar48;
            (ptVar27->pos).lno = iVar17;
            (ptVar27->pos).ln_pos = iVar18;
            ptVar27->repr = "";
            ptVar27->node_code = N_IGNORE;
            ptVar27->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)pcVar32->buffered_tokens,ptVar27);
            return;
          }
          if (pcVar35 == (c2m_ctx_t)0x0) goto LAB_001915c7;
          if (pcVar35->ctx == (MIR_context_t)0x1) {
            puVar38 = (undefined8 *)pcVar35->env[0].__jmpbuf[0];
            if (puVar38 != (undefined8 *)0x0) {
              sVar1 = *(short *)*puVar38;
              if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00190f19;
              goto LAB_00190ee0;
            }
            goto LAB_001915d6;
          }
          if (pcVar35->ctx == (MIR_context_t)0x0) {
LAB_00190f19:
            pcVar48 = (ptVar27->pos).fname;
            lVar23 = *(long *)&(ptVar27->pos).lno;
            pcVar24 = (c2m_ctx_t)reg_malloc(pcVar32,0x30);
            *(undefined4 *)&pcVar24->ctx = 0x141;
            ((pos_t *)&pcVar24->options)->fname = pcVar48;
            pcVar24->env[0].__jmpbuf[0] = lVar23;
            pcVar24->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar24->env[0].__jmpbuf + 1) = 0;
            pcVar24->env[0].__jmpbuf[2] = 0;
            goto LAB_00190f77;
          }
LAB_00190ee0:
          pcVar47 = (c2m_ctx_t)pcVar46->env[0].__jmpbuf[3];
          add_tokens((VARR_token_t *)pcVar47,(VARR_token_t *)pcVar35);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              puVar6 = (uint *)pcVar46->env[0].__jmpbuf[3];
              if (puVar6 == (uint *)0x0) goto LAB_001915ea;
              uStack_bc = *puVar6;
            }
            else {
              uStack_bc = 0xffffffff;
            }
          }
LAB_00190f61:
          pcVar24 = (c2m_ctx_t)copy_token(pcVar32,ptVar27,*(pos_t *)&pcVar46->options);
LAB_00190f77:
          pcVar47 = (c2m_ctx_t)pcVar46->env[0].__jmpbuf[3];
          add_token((VARR_token_t *)pcVar47,(token_t)pcVar24);
          pcVar35 = pcVar24;
        }
        iVar18 = (int)pcVar46->env[0].__jmpbuf[2];
      } while (iVar18 < iVar17);
    }
    ptVar27 = get_next_pptoken_1(pcVar32,0);
    unget_next_pptoken((c2m_ctx_t)pcVar32->buffered_tokens,ptVar27);
    pcVar48 = (ptVar27->pos).fname;
    iVar17 = (ptVar27->pos).lno;
    iVar18 = (ptVar27->pos).ln_pos;
    ptVar27 = (token_t)reg_malloc(pcVar32,0x30);
    *(undefined4 *)ptVar27 = 0x145;
    (ptVar27->pos).fname = pcVar48;
    (ptVar27->pos).lno = iVar17;
    (ptVar27->pos).ln_pos = iVar18;
    ptVar27->repr = "";
    ptVar27->node_code = N_IGNORE;
    ptVar27->node = (node_t_conflict)0x0;
    unget_next_pptoken((c2m_ctx_t)pcVar32->buffered_tokens,ptVar27);
    pVVar20 = (VARR_token_t *)pcVar46->env[0].__jmpbuf[3];
    do_concat(pcVar32,pVVar20);
    push_back(pcVar32,pVVar20);
    pMVar40->func_redef_permission_p = 1;
    return;
  }
LAB_001915e0:
  process_replacement_cold_19();
LAB_001915e5:
  process_replacement_cold_16();
  pcVar35 = pcVar21;
LAB_001915ea:
  process_replacement_cold_1();
LAB_001915ef:
  process_replacement_cold_15();
LAB_001915f4:
  process_replacement_cold_14();
  pcVar21 = pcVar35;
LAB_001915f9:
  pcVar35 = pcVar21;
  process_replacement_cold_17();
LAB_001915fe:
  process_replacement_cold_13();
  pcVar21 = pcVar35;
LAB_00191603:
  process_replacement_cold_5();
LAB_00191608:
  process_replacement_cold_6();
  pcVar35 = pcVar47;
LAB_0019160d:
  process_replacement_cold_4();
  ppVar3 = pcVar35->pre_ctx;
  while( true ) {
    ptVar27 = get_next_pptoken_1(pcVar35,0);
    if ((short)*(uint *)ptVar27 != 0x145) break;
    pop_macro_call((c2m_ctx_t)pcVar35->pre_ctx->macro_call_stack);
  }
  uVar16 = *(uint *)ptVar27 & 0xffff;
  pMVar40 = (MIR_context_t)(ulong)uVar16;
  if ((uVar16 == 10) || (uVar16 == 0x20)) {
    ptVar28 = get_next_pptoken_1(pcVar35,0);
    pMVar40 = (MIR_context_t)(ulong)*(ushort *)ptVar28;
    t_01 = ptVar27;
  }
  else {
    t_01 = (token_t)0x0;
    ptVar28 = ptVar27;
  }
  if ((int)pMVar40 != 0x28) {
    unget_next_pptoken((c2m_ctx_t)pcVar35->buffered_tokens,ptVar28);
    if (t_01 != (token_t)0x0) {
      unget_next_pptoken((c2m_ctx_t)pcVar35->buffered_tokens,t_01);
    }
    out_token(pcVar35,t_00);
    return;
  }
  pcVar46 = (c2m_ctx_t)(t_00->pos).fname;
  pmVar29 = new_macro_call((macro_t)pcVar21,t_00->pos);
  pmVar9 = pmVar29->macro;
  pcVar47 = (c2m_ctx_t)&DAT_00000018;
  pVVar30 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar30 == (VARR_token_arr_t *)0x0) {
LAB_00191caf:
    mir_varr_error((char *)pcVar47);
  }
  pVVar30->els_num = 0;
  pVVar30->size = 0x10;
  pcStack_118 = (c2m_ctx_t)malloc(0x80);
  pcVar47 = (c2m_ctx_t)&DAT_00000018;
  pVVar30->varr = (token_arr_t *)pcStack_118;
  puVar31 = (ulong *)malloc(0x18);
  if (puVar31 == (ulong *)0x0) goto LAB_00191caf;
  pcVar47 = (c2m_ctx_t)0x80;
  *puVar31 = 0;
  puVar31[1] = 0x10;
  pvVar22 = malloc(0x80);
  puVar31[2] = (ulong)pvVar22;
  pVVar20 = pmVar9->params;
  if (pVVar20 == (VARR_token_t *)0x0) {
LAB_00191cc3:
    try_param_macro_call_cold_16();
LAB_00191cc8:
    try_param_macro_call_cold_14();
    goto LAB_00191ccd;
  }
  pMVar25 = (MIR_context_t)pVVar20->els_num;
  iVar17 = 0;
  bVar57 = false;
  if (pMVar25 != (MIR_context_t)0x1) {
LAB_00191751:
    pMVar50 = (MIR_context_t)0x10;
    bVar58 = false;
    pMStack_138 = (MIR_context_t)0x0;
    pMStack_130 = (MIR_context_t)0x0;
    pMVar39 = (MIR_context_t)((long)&pMVar25[-1].wrapper_end_addr + 7);
    do {
      pcVar46 = (c2m_ctx_t)0x0;
      pcVar47 = pcVar35;
      pcVar32 = (c2m_ctx_t)get_next_pptoken_1(pcVar35,0);
      uVar2 = *(ushort *)&pcVar32->ctx;
      if (uVar2 == 0x145) {
        pcVar46 = (c2m_ctx_t)0x0;
        pcVar32 = (c2m_ctx_t)get_next_pptoken_1(pcVar35,0);
        pcVar47 = (c2m_ctx_t)pcVar35->pre_ctx->macro_call_stack;
        pop_macro_call(pcVar47);
        uVar2 = *(ushort *)&pcVar32->ctx;
      }
      uVar16 = (uint)uVar2;
      uVar42 = uVar16 * 0x10000 + 0xfec30000 >> 0x10;
      if (((uVar42 < 0xb) && (pcVar46 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar42 & 0x1f) & 1) != 0)) ||
         (pMVar40 = (MIR_context_t)(ulong)CONCAT31((int3)(uVar16 * 0x10000 >> 8),uVar16 == 0x23),
         (bool)(bVar58 & uVar16 == 0x23))) {
LAB_001919f1:
        if (uVar16 != 0x29) {
          in_R8 = (char **)pmVar9->id->repr;
          error(pcVar35,0x1c19de,(char *)pcVar32->options,pcVar32->env[0].__jmpbuf[0]);
          pcVar47 = (c2m_ctx_t)pcVar35->buffered_tokens;
          pcVar46 = pcVar32;
          unget_next_pptoken(pcVar47,(token_t)pcVar32);
        }
        pMVar40 = pMStack_138;
        if (pcStack_118 == (c2m_ctx_t)0x0) goto LAB_00191cc8;
        pMVar39 = (MIR_context_t)((long)&pMStack_138->gen_ctx + 1);
        if (pMVar50 < pMVar39) {
          pMVar50 = (MIR_context_t)((long)&pMVar39->gen_ctx + ((ulong)pMVar39 >> 1));
          pcVar46 = (c2m_ctx_t)((long)pMVar50 * 8);
          pcVar47 = pcStack_118;
          pcStack_118 = (c2m_ctx_t)realloc(pcStack_118,(size_t)pcVar46);
          pVVar30->varr = (token_arr_t *)pcStack_118;
          pVVar30->size = (size_t)pMVar50;
          pMVar39 = (MIR_context_t)((long)&((MIR_context_t)pVVar30->els_num)->gen_ctx + 1);
          pMVar40 = (MIR_context_t)pVVar30->els_num;
        }
        pVVar30->els_num = (size_t)pMVar39;
        pcStack_118->env[0].__jmpbuf[(long)((long)&pMVar40[-1].wrapper_end_addr + 6)] =
             (long)puVar31;
        if ((pMVar25 == (MIR_context_t)0x0) && (pMVar39 == (MIR_context_t)0x1)) {
          if (pVVar30->varr == (token_arr_t *)0x0) goto LAB_00191cdc;
          pcVar21 = (c2m_ctx_t)*pVVar30->varr;
          if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_00191ce1;
          if (pcVar21->ctx == (MIR_context_t)0x0) {
            pcVar47 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[0];
            pVVar30->els_num = 0;
            if (pcVar47 == (c2m_ctx_t)0x0) goto LAB_00191cfa;
LAB_00191c30:
            free(pcVar47);
            free(pcVar21);
            pcVar47 = pcVar21;
            goto LAB_00191c3d;
          }
          if (pcVar21->ctx == (MIR_context_t)0x1) {
            pcVar47 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[0];
            if (pcVar47 == (c2m_ctx_t)0x0) goto LAB_00191cf5;
            if (*(short *)&pcVar47->ctx->gen_ctx == 0x20) {
              pVVar30->els_num = 0;
              goto LAB_00191c30;
            }
          }
        }
        if (pMVar39 <= pMVar25) {
          if (pMVar25 <= pMVar39) goto LAB_00191c3d;
          pMStack_150 = (MIR_context_t)0x1c1a1d;
          goto LAB_00191b75;
        }
        ppVVar34 = pVVar30->varr;
        if (ppVVar34 == (token_arr_t *)0x0) goto LAB_00191ce6;
        pVVar33 = ppVVar34[(long)pMVar25];
        if (pVVar33 == (token_arr_t)0x0) goto LAB_00191ceb;
        if (pVVar33->els_num != 0) {
          if (pVVar33->varr == (token_t *)0x0) goto LAB_00191cf0;
          pcVar32 = (c2m_ctx_t)*pVVar33->varr;
        }
        pMStack_150 = (MIR_context_t)0x1c19fa;
        goto LAB_00191b23;
      }
      if (iVar17 == 0) {
        if (uVar16 == 0x29) goto LAB_001919f1;
        if ((bVar57) || (uVar16 != 0x2c)) goto LAB_001917fe;
        if (pcStack_118 == (c2m_ctx_t)0x0) goto LAB_00191cd2;
        pMVar52 = (MIR_context_t)((long)&pMStack_130->gen_ctx + 1);
        pMVar40 = pMStack_130;
        pMStack_130 = pMVar52;
        if (pMVar50 < pMVar52) {
          pMVar50 = (MIR_context_t)((long)&pMVar52->gen_ctx + ((ulong)pMVar52 >> 1));
          pcVar46 = (c2m_ctx_t)((long)pMVar50 * 8);
          pcStack_118 = (c2m_ctx_t)realloc(pcStack_118,(size_t)pcVar46);
          pVVar30->varr = (token_arr_t *)pcStack_118;
          pVVar30->size = (size_t)pMVar50;
          pMVar40 = (MIR_context_t)pVVar30->els_num;
          pMStack_130 = (MIR_context_t)((long)&pMVar40->gen_ctx + 1);
        }
        pcVar47 = (c2m_ctx_t)&DAT_00000018;
        pVVar30->els_num = (size_t)pMStack_130;
        pcStack_118->env[0].__jmpbuf[(long)((long)&pMVar40[-1].wrapper_end_addr + 6)] =
             (long)puVar31;
        puVar31 = (ulong *)malloc(0x18);
        if (puVar31 == (ulong *)0x0) goto LAB_00191caf;
        pcVar47 = (c2m_ctx_t)0x80;
        *puVar31 = 0;
        puVar31[1] = 0x10;
        pvVar22 = malloc(0x80);
        puVar31[2] = (ulong)pvVar22;
        iVar17 = 0;
        if (pMStack_130 == pMVar39) {
          pVVar20 = pmVar9->params;
          if (((pVVar20 == (VARR_token_t *)0x0) ||
              (pMVar40 = (MIR_context_t)pVVar20->varr, pMVar40 == (MIR_context_t)0x0)) ||
             ((MIR_context_t)pVVar20->els_num <= pMVar39)) goto LAB_00191cbe;
          iVar18 = strcmp(*(char **)(*(long *)((long)pMVar40 + (long)pMVar25 * 8 + -8) + 0x28),"..."
                         );
          bVar57 = iVar18 == 0;
          pMStack_130 = pMVar39;
          pMStack_138 = pMVar39;
        }
        else {
          bVar57 = false;
          pMStack_138 = pMStack_130;
        }
      }
      else {
LAB_001917fe:
        pvVar22 = (void *)puVar31[2];
        if (pvVar22 == (void *)0x0) goto LAB_00191cb9;
        uVar43 = *puVar31;
        uVar49 = uVar43 + 1;
        if (puVar31[1] < uVar49) {
          uVar49 = (uVar49 >> 1) + uVar49;
          pvVar22 = realloc(pvVar22,uVar49 * 8);
          puVar31[2] = (ulong)pvVar22;
          puVar31[1] = uVar49;
          uVar43 = *puVar31;
          uVar49 = uVar43 + 1;
        }
        *puVar31 = uVar49;
        *(c2m_ctx_t *)((long)pvVar22 + uVar43 * 8) = pcVar32;
        if (*(short *)&pcVar32->ctx == 0x28) {
          iVar17 = iVar17 + 1;
        }
        else if (*(short *)&pcVar32->ctx == 0x29) {
          iVar17 = iVar17 + -1;
        }
      }
      bVar58 = *(short *)&pcVar32->ctx == 10;
    } while( true );
  }
  if (pVVar20->varr != (token_t *)0x0) {
    bVar57 = *(short *)*pVVar20->varr == 0x10f;
    goto LAB_00191751;
  }
  goto LAB_00191cd7;
LAB_00191b75:
  pMVar52 = (MIR_context_t)((long)&pMVar39->gen_ctx + 1);
  pcVar47 = (c2m_ctx_t)&DAT_00000018;
  pVVar33 = (token_arr_t)malloc(0x18);
  if (pVVar33 != (token_arr_t)0x0) {
    pcVar47 = (c2m_ctx_t)0x80;
    pVVar33->els_num = 0;
    pVVar33->size = 0x10;
    pptVar19 = (token_t *)malloc(0x80);
    pVVar33->varr = pptVar19;
    ppVVar34 = pVVar30->varr;
    if (ppVVar34 != (token_arr_t *)0x0) goto code_r0x00191bb5;
    try_param_macro_call_cold_6();
LAB_00191cb9:
    try_param_macro_call_cold_1();
LAB_00191cbe:
    try_param_macro_call_cold_2();
    goto LAB_00191cc3;
  }
  goto LAB_00191caf;
code_r0x00191bb5:
  pMVar40 = pMVar39;
  if (pMVar50 <= pMVar39) {
    pMVar50 = (MIR_context_t)((long)&pMVar52->gen_ctx + ((ulong)pMVar52 >> 1));
    pcVar46 = (c2m_ctx_t)((long)pMVar50 * 8);
    ppVVar34 = (token_arr_t *)realloc(ppVVar34,(size_t)pcVar46);
    pVVar30->varr = ppVVar34;
    pVVar30->size = (size_t)pMVar50;
  }
  pVVar30->els_num = (size_t)pMVar52;
  ppVVar34[(long)pMVar39] = pVVar33;
  pMVar39 = pMVar52;
  if (pMVar25 <= pMVar52) goto LAB_00191bf5;
  goto LAB_00191b75;
  while( true ) {
    pcVar53 = (c2m_ctx_t)((long)&pcVar53[-1].gen_ctx + 7);
    pcVar24 = (c2m_ctx_t)(((__jmp_buf_tag *)pcVar24)->__jmpbuf + 1);
    if (pcVar21 == pcVar53) break;
LAB_00191dfe:
    pcVar32 = (c2m_ctx_t)((__jmp_buf_tag *)pcVar24)->__jmpbuf[0];
    if (*(int *)(pcVar32->env[0].__jmpbuf + 1) == 0x19) {
      pVVar44 = pcVar47->symbol_text;
      if ((pVVar44 == (VARR_char *)0x0) ||
         (pcVar35 = (c2m_ctx_t)pVVar44->varr, pcVar35 == (c2m_ctx_t)0x0)) goto LAB_00192256;
      pVVar44->els_num = 0;
      pVVar11 = pcVar47->temp_string;
      if ((pVVar11 == (VARR_char *)0x0) || (pVVar11->varr == (char *)0x0)) goto LAB_0019225b;
      pVVar11->els_num = 0;
      pcVar32 = (c2m_ctx_t)pVVar44->els_num;
      puVar41 = (undefined1 *)((long)&pcVar32->ctx + 1);
      if ((undefined1 *)pVVar44->size < puVar41) {
        pcVar21 = pcVar35;
        pcVar35 = (c2m_ctx_t)realloc(pcVar35,(size_t)(puVar41 + ((ulong)puVar41 >> 1)));
        pVVar44->varr = (char *)pcVar35;
        pVVar44->size = (size_t)(puVar41 + ((ulong)puVar41 >> 1));
        pcVar32 = (c2m_ctx_t)pVVar44->els_num;
        puVar41 = (undefined1 *)((long)&pcVar32->ctx + 1);
      }
      pVVar44->els_num = (size_t)puVar41;
      *(undefined1 *)((long)pcVar32->env[0].__saved_mask.__val + (long)(pcVar35->env + -1) + 0x60) =
           0x3c;
      if (pcVar45 < (c2m_ctx_t)((long)pcVar26 - (long)pcVar53)) goto LAB_00191f68;
      goto LAB_0019205a;
    }
  }
LAB_00191e17:
  if (pcVar35 != (c2m_ctx_t)0x0) goto LAB_00191e1c;
  goto LAB_00191e37;
LAB_00191f68:
  do {
    pptVar12 = (token_t *)pcVar46->env[0].__jmpbuf[0];
    if ((pptVar12 == (token_t *)0x0) || ((c2m_ctx_t)pcVar46->ctx <= pcVar45)) {
LAB_0019223d:
      get_header_name_cold_9();
      goto LAB_00192242;
    }
    pcVar48 = pptVar12[(long)pcVar45]->repr;
    cVar51 = *pcVar48;
    while (cVar51 != '\0') {
      pVVar44 = pcVar47->symbol_text;
      pcVar35 = (c2m_ctx_t)pVVar44->varr;
      if (pcVar35 == (c2m_ctx_t)0x0) {
LAB_00192238:
        get_header_name_cold_2();
        goto LAB_0019223d;
      }
      sVar55 = pVVar44->els_num;
      uVar49 = sVar55 + 1;
      if (pVVar44->size < uVar49) {
        pcVar24 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
        pcVar32 = pcVar24;
        pcVar21 = pcVar35;
        pcVar35 = (c2m_ctx_t)realloc(pcVar35,(size_t)pcVar24);
        pVVar44->varr = (char *)pcVar35;
        pVVar44->size = (size_t)pcVar24;
        sVar55 = pVVar44->els_num;
        uVar49 = sVar55 + 1;
      }
      pVVar44->els_num = uVar49;
      *(char *)((long)pcVar35->env[0].__jmpbuf + (sVar55 - 0x10)) = cVar51;
      pVVar44 = pcVar47->temp_string;
      pcVar35 = (c2m_ctx_t)pVVar44->varr;
      if (pcVar35 == (c2m_ctx_t)0x0) {
        get_header_name_cold_1();
        goto LAB_00192238;
      }
      sVar55 = pVVar44->els_num;
      cVar51 = *pcVar48;
      uVar49 = sVar55 + 1;
      if (pVVar44->size < uVar49) {
        pcVar24 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
        pcVar32 = pcVar24;
        pcVar21 = pcVar35;
        pcVar35 = (c2m_ctx_t)realloc(pcVar35,(size_t)pcVar24);
        pVVar44->varr = (char *)pcVar35;
        pVVar44->size = (size_t)pcVar24;
        sVar55 = pVVar44->els_num;
        uVar49 = sVar55 + 1;
      }
      pVVar44->els_num = uVar49;
      *(char *)((long)pcVar35->env[0].__jmpbuf + (sVar55 - 0x10)) = cVar51;
      cVar51 = pcVar48[1];
      pcVar48 = pcVar48 + 1;
    }
    pcVar45 = (c2m_ctx_t)((long)&pcVar45->ctx + 1);
  } while ((c2m_ctx_t)((long)pcVar26 - (long)pcVar53) != pcVar45);
LAB_0019205a:
  pVVar44 = pcVar47->symbol_text;
  pcVar35 = (c2m_ctx_t)pVVar44->varr;
  if (pcVar35 == (c2m_ctx_t)0x0) goto LAB_00192265;
  sVar55 = pVVar44->els_num;
  uVar49 = sVar55 + 1;
  if (pVVar44->size < uVar49) {
    pcVar24 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
    pcVar32 = pcVar24;
    pcVar21 = pcVar35;
    pcVar35 = (c2m_ctx_t)realloc(pcVar35,(size_t)pcVar24);
    pVVar44->varr = (char *)pcVar35;
    pVVar44->size = (size_t)pcVar24;
    sVar55 = pVVar44->els_num;
    uVar49 = sVar55 + 1;
  }
  pVVar44->els_num = uVar49;
  *(undefined1 *)((long)pcVar35->env[0].__jmpbuf + (sVar55 - 0x10)) = 0x3e;
  pVVar44 = pcVar47->symbol_text;
  pcVar35 = (c2m_ctx_t)pVVar44->varr;
  if (pcVar35 == (c2m_ctx_t)0x0) goto LAB_0019226a;
  sVar55 = pVVar44->els_num;
  uVar49 = sVar55 + 1;
  if (pVVar44->size < uVar49) {
    pcVar24 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
    pcVar32 = pcVar24;
    pcVar21 = pcVar35;
    pcVar35 = (c2m_ctx_t)realloc(pcVar35,(size_t)pcVar24);
    pVVar44->varr = (char *)pcVar35;
    pVVar44->size = (size_t)pcVar24;
    sVar55 = pVVar44->els_num;
    uVar49 = sVar55 + 1;
  }
  pVVar44->els_num = uVar49;
  *(undefined1 *)((long)pcVar35->env[0].__jmpbuf + (sVar55 - 0x10)) = 0;
  pVVar44 = pcVar47->temp_string;
  pcVar48 = pVVar44->varr;
  if (pcVar48 == (char *)0x0) goto LAB_0019226f;
  sVar55 = pVVar44->els_num;
  uVar49 = sVar55 + 1;
  if (pVVar44->size < uVar49) {
    sVar54 = (uVar49 >> 1) + uVar49;
    pcVar48 = (char *)realloc(pcVar48,sVar54);
    pVVar44->varr = pcVar48;
    pVVar44->size = sVar54;
    sVar55 = pVVar44->els_num;
    uVar49 = sVar55 + 1;
  }
  pVVar44->els_num = uVar49;
  pcVar48[sVar55] = '\0';
  pcVar32 = (c2m_ctx_t)((ulong)pcVar26 & 0xffffffff);
  pcVar21 = pcVar46;
  del_tokens((VARR_token_t *)pcVar46,(int)pcVar26,-(int)pcVar53);
  if (pcVar47->symbol_text != (VARR_char *)0x0) {
    if (pcVar47->temp_string == (VARR_char *)0x0) goto LAB_00192279;
    pcVar48 = pcVar47->symbol_text->varr;
    sVar59 = uniq_cstr(pcVar47,pcVar47->temp_string->varr);
    pnVar36 = new_node(pcVar47,N_STR);
    add_pos(pcVar47,pnVar36,pVar13);
    (pnVar36->u).s = sVar59;
    sVar59 = uniq_cstr(pcVar47,pcVar48);
    pcVar32 = (c2m_ctx_t)0x30;
    pcVar21 = pcVar47;
    ptVar27 = (token_t)reg_malloc(pcVar47,0x30);
    *(undefined4 *)ptVar27 = 0x13e;
    (ptVar27->pos).fname = (char *)pcVar56;
    *(token_t **)&(ptVar27->pos).lno = pptVar19;
    ptVar27->repr = sVar59.s;
    ptVar27->node_code = N_IGNORE;
    ptVar27->node = pnVar36;
    pptVar19 = (token_t *)pcVar46->env[0].__jmpbuf[0];
    if ((pptVar19 != (token_t *)0x0) && (pcVar35 = (c2m_ctx_t)pcVar46->ctx, pcVar26 < pcVar35)) {
      pptVar19[(long)pcVar26] = ptVar27;
      goto LAB_00191e1c;
    }
    goto LAB_00192260;
  }
  goto LAB_00192274;
  while( true ) {
    free(pcVar47);
    free(pcVar46);
    pcVar47 = pcVar46;
    pMVar39 = pMVar40;
    if (pMVar40 <= pMVar25) break;
LAB_00191b23:
    pMVar40 = (MIR_context_t)((long)&pMVar39[-1].wrapper_end_addr + 7);
    pVVar30->els_num = (size_t)pMVar40;
    pcVar46 = (c2m_ctx_t)ppVVar34[(long)((long)&pMVar39[-1].wrapper_end_addr + 7)];
    if ((pcVar46 == (c2m_ctx_t)0x0) ||
       (pcVar47 = (c2m_ctx_t)pcVar46->env[0].__jmpbuf[0], pcVar47 == (c2m_ctx_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00191caf;
    }
  }
LAB_00191bf5:
  pcVar46 = (c2m_ctx_t)((pos_t *)&pcVar32->options)->fname;
  in_R8 = (char **)pmVar9->id->repr;
  error(pcVar35,pMStack_150,(char *)pcVar46,pcVar32->env[0].__jmpbuf[0]);
  pMVar40 = pMStack_150;
  pcVar47 = pcVar35;
LAB_00191c3d:
  pmVar29->args = pVVar30;
  pVVar10 = ppVar3->macro_call_stack;
  __ptr = pVVar10->varr;
  if (__ptr != (macro_call_t *)0x0) {
    sVar55 = pVVar10->els_num;
    uVar49 = sVar55 + 1;
    if (pVVar10->size < uVar49) {
      sVar55 = (uVar49 >> 1) + uVar49;
      __ptr = (macro_call_t *)realloc(__ptr,sVar55 * 8);
      pVVar10->varr = __ptr;
      pVVar10->size = sVar55;
      sVar55 = pVVar10->els_num;
      uVar49 = sVar55 + 1;
    }
    pVVar10->els_num = uVar49;
    __ptr[sVar55] = pmVar29;
    return;
  }
LAB_00191ccd:
  try_param_macro_call_cold_8();
LAB_00191cd2:
  try_param_macro_call_cold_3();
LAB_00191cd7:
  try_param_macro_call_cold_15();
LAB_00191cdc:
  try_param_macro_call_cold_13();
LAB_00191ce1:
  try_param_macro_call_cold_12();
LAB_00191ce6:
  try_param_macro_call_cold_11();
LAB_00191ceb:
  try_param_macro_call_cold_10();
LAB_00191cf0:
  try_param_macro_call_cold_7();
LAB_00191cf5:
  try_param_macro_call_cold_4();
LAB_00191cfa:
  try_param_macro_call_cold_5();
  pvVar22 = (void *)pcVar47->env[0].__jmpbuf[0];
  if (pvVar22 != (void *)0x0) {
    pMVar25 = pcVar47->ctx;
    pMVar40 = (MIR_context_t)((long)&pMVar25->gen_ctx + 1);
    if ((MIR_context_t)pcVar47->options < pMVar40) {
      pcVar56 = (c2mir_options *)((long)&pMVar40->gen_ctx + ((ulong)pMVar40 >> 1));
      pvVar22 = realloc(pvVar22,(long)pcVar56 * 8);
      pcVar47->env[0].__jmpbuf[0] = (long)pvVar22;
      pcVar47->options = pcVar56;
      pMVar25 = pcVar47->ctx;
      pMVar40 = (MIR_context_t)((long)&pMVar25->gen_ctx + 1);
    }
    pcVar47->ctx = pMVar40;
    *(c2m_ctx_t *)((long)pvVar22 + (long)pMVar25 * 8) = pcVar46;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar47 != (c2m_ctx_t)0x0) && (pcVar47->env[0].__jmpbuf[0] != 0)) &&
     (pMVar40 = pcVar47->ctx, pMVar40 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar32 = pcVar46;
  pcVar21 = pcVar47;
  if (pcVar46 == (c2m_ctx_t)0x0) {
LAB_00192242:
    get_header_name_cold_15();
LAB_00192247:
    get_header_name_cold_13();
LAB_0019224c:
    get_header_name_cold_12();
  }
  else {
    pcVar35 = (c2m_ctx_t)pcVar46->ctx;
    if (pcVar35 != (c2m_ctx_t)0x0) {
      pcVar21 = (c2m_ctx_t)pcVar46->env[0].__jmpbuf[0];
      if (pcVar21 == (c2m_ctx_t)0x0) goto LAB_00192247;
      pcVar26 = (c2m_ctx_t)0x0;
      pcVar24 = pcVar21;
      do {
        pcVar24 = (c2m_ctx_t)&pcVar24->options;
        pcVar32 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[(long)((long)&pcVar26[-1].gen_ctx + 6)];
        if (*(short *)&pcVar32->ctx != 0x20) {
          if ((*(int *)(pcVar32->env[0].__jmpbuf + 1) != 0x17) ||
             (pcVar45 = (c2m_ctx_t)((long)&pcVar26->ctx + 1), pcVar35 <= pcVar45))
          goto LAB_00191e17;
          pcVar56 = pcVar32->options;
          pptVar19 = (token_t *)pcVar32->env[0].__jmpbuf[0];
          pVar13 = *(pos_t *)&pcVar32->options;
          pcVar21 = (c2m_ctx_t)((long)pcVar26 - (long)pcVar35);
          pcVar53 = (c2m_ctx_t)0xffffffffffffffff;
          goto LAB_00191dfe;
        }
        pcVar26 = (c2m_ctx_t)((long)&pcVar26->ctx + 1);
      } while (pcVar26 != pcVar35);
LAB_00191e1c:
      pptVar19 = (token_t *)pcVar46->env[0].__jmpbuf[0];
      if (pptVar19 != (token_t *)0x0) {
        pcVar24 = (c2m_ctx_t)(ulong)(*(short *)*pptVar19 == 0x20);
        goto LAB_00191e3b;
      }
      goto LAB_0019224c;
    }
LAB_00191e37:
    pcVar35 = (c2m_ctx_t)0x0;
    pcVar24 = (c2m_ctx_t)0x0;
LAB_00191e3b:
    pcVar32 = (c2m_ctx_t)((long)&pcVar35[-1].gen_ctx + 7);
    if (pcVar24 != pcVar32) {
LAB_00191e88:
      error(pcVar47,0x1c1443,format,pMVar40);
      return;
    }
    if ((pcVar24 < pcVar35) &&
       (pptVar19 = (token_t *)pcVar46->env[0].__jmpbuf[0], pptVar19 != (token_t *)0x0)) {
      ptVar27 = pptVar19[(long)pcVar24];
      sVar1 = *(short *)ptVar27;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar47,ptVar27,in_R8);
        return;
      }
      goto LAB_00191e88;
    }
  }
  get_header_name_cold_14();
LAB_00192256:
  get_header_name_cold_11();
LAB_0019225b:
  get_header_name_cold_10();
LAB_00192260:
  get_header_name_cold_3();
LAB_00192265:
  get_header_name_cold_8();
LAB_0019226a:
  get_header_name_cold_7();
LAB_0019226f:
  get_header_name_cold_6();
LAB_00192274:
  get_header_name_cold_5();
LAB_00192279:
  get_header_name_cold_4();
  plVar37 = (long *)malloc(0x30);
  pcVar48 = &DAT_00000018;
  *plVar37 = (long)pcVar21;
  plVar37[1] = (long)pcVar32;
  plVar37[2] = extraout_RDX_00;
  *(undefined4 *)(plVar37 + 4) = 0;
  plVar37[3] = 0;
  puVar38 = (undefined8 *)malloc(0x18);
  plVar37[5] = (long)puVar38;
  if (puVar38 == (undefined8 *)0x0) {
    mir_varr_error(pcVar48);
  }
  *puVar38 = 0;
  puVar38[1] = 0x40;
  pvVar22 = malloc(0x200);
  puVar38[2] = pvVar22;
  return;
}

Assistant:

static void out_token (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (no_out_p || VARR_LENGTH (macro_call_t, macro_call_stack) != 0) {
    VARR_PUSH (token_t, output_buffer, t);
    return;
  }
  flush_buffer (c2m_ctx);
  pre_out_token_func (c2m_ctx, t);
}